

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::range(HighsSparseMatrix *this,double *min_value,double *max_value)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  lVar2 = (long)(this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[this->num_col_];
  if (0 < lVar2) {
    pdVar1 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      dVar4 = ABS(pdVar1[lVar3]);
      dVar5 = dVar4;
      if (*min_value <= dVar4) {
        dVar5 = *min_value;
      }
      *min_value = dVar5;
      if (dVar4 <= *max_value) {
        dVar4 = *max_value;
      }
      *max_value = dVar4;
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return;
}

Assistant:

void HighsSparseMatrix::range(double& min_value, double& max_value) const {
  assert(this->formatOk());
  for (HighsInt iEl = 0; iEl < this->start_[this->num_col_]; iEl++) {
    double value = fabs(this->value_[iEl]);
    min_value = min(min_value, value);
    max_value = max(max_value, value);
  }
}